

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<double,_1,_1> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,double *outSumLogLikelihoodByPartition)

{
  threadData *ptVar1;
  long lVar2;
  ulong uVar3;
  packaged_task<void_()> *__args;
  double *pdVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int i;
  int local_11c;
  __shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2> local_118;
  long local_100;
  double *local_f8;
  int *local_f0;
  double *local_e8;
  int *local_e0;
  BeagleCPUImpl<double,_1,_1> *local_d8;
  packaged_task<void_()> threadTask;
  int *stateFrequenciesIndices_local;
  int *categoryWeightsIndices_local;
  int *probabilityIndices_local;
  int *childBufferIndices_local;
  int *parentBufferIndices_local;
  unique_lock<std::mutex> l;
  
  lVar6 = 0;
  __args = (packaged_task<void_()> *)&probabilityIndices_local;
  local_100 = 0x88;
  pdVar4 = outSumLogLikelihoodByPartition;
  piVar5 = partitionIndices;
  stateFrequenciesIndices_local = stateFrequenciesIndices;
  categoryWeightsIndices_local = categoryWeightsIndices;
  probabilityIndices_local = probabilityIndices;
  childBufferIndices_local = childBufferIndices;
  parentBufferIndices_local = parentBufferIndices;
  for (lVar7 = 0; uVar3 = (ulong)this->kNumThreads, lVar7 < (long)uVar3; lVar7 = lVar7 + 1) {
    local_118 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )ZEXT816(0x279);
    local_11c = 1;
    local_f8 = pdVar4;
    local_f0 = piVar5;
    local_e8 = pdVar4;
    local_e0 = piVar5;
    local_d8 = this;
    std::
    _Bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
    ::
    _Bind<beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*&,int_const*&,int_const*&,int_const*&,int_const*&,int_const*&,int_const*,int,double*>
              ((_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>
                *)&l,(offset_in_BeagleCPUImpl<double,_1,_1>_to_subr *)&local_118,&local_d8,
               &parentBufferIndices_local,&childBufferIndices_local,&probabilityIndices_local,
               &categoryWeightsIndices_local,&stateFrequenciesIndices_local,&cumulativeScaleIndices,
               &local_e0,&local_11c,&local_e8);
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              ((packaged_task<void()> *)&threadTask,
               (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_1>::*(beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
                *)&l);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_118);
    l._M_device = (mutex_type *)local_118._M_ptr;
    l._8_8_ = local_118._M_refcount._M_pi;
    local_118 = (__shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                 )(ZEXT816(0) << 0x20);
    std::shared_future<void>::operator=
              ((shared_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar6),(shared_future<void> *)&l);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&l._M_owns);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    lVar2 = local_100;
    ptVar1 = this->gThreads;
    std::unique_lock<std::mutex>::unique_lock
              (&l,(mutex_type *)((long)&(ptVar1->t)._M_id._M_thread + local_100));
    __args = &threadTask;
    std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
    emplace_back<std::packaged_task<void()>>
              ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)
               ((long)ptVar1 + lVar2 + -0x80),__args);
    std::unique_lock<std::mutex>::unlock(&l);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(&l);
    std::packaged_task<void_()>::~packaged_task(&threadTask);
    local_100 = lVar2 + 0xb8;
    lVar6 = lVar6 + 0x10;
    pdVar4 = local_f8 + 1;
    piVar5 = local_f0 + 1;
  }
  lVar6 = 0;
  for (lVar7 = 0; lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)
               ((long)&(this->gFutures->super___basic_future<void>)._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar6),__args);
    uVar3 = (ulong)(uint)this->kNumThreads;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByAutoPartitionAsync(
                                                        const int* parentBufferIndices,
                                                        const int* childBufferIndices,
                                                        const int* probabilityIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition, this,
                      parentBufferIndices,
                      childBufferIndices,
                      probabilityIndices,
                      categoryWeightsIndices,
                      stateFrequenciesIndices,
                      cumulativeScaleIndices,
                      &partitionIndices[i],
                      1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}